

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_impl.h
# Opt level: O3

void __thiscall spdlog::logger::default_err_handler_(logger *this,string *msg)

{
  FILE *__s;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  time_t now;
  tm tm_time;
  char date_buf [100];
  __atomic_base<long> local_310;
  char *local_308 [2];
  pointer local_2f8;
  size_type sStack_2f0;
  pointer local_2e8;
  size_type sStack_2e0;
  undefined **local_2d8;
  undefined1 *local_2d0;
  size_t local_2c8;
  ulong local_2c0;
  undefined1 local_2b8 [504];
  tm local_c0;
  char local_88 [104];
  
  local_310._M_i = time((time_t *)0x0);
  if (0x3b < local_310._M_i - (this->last_err_time_).super___atomic_base<long>._M_i) {
    LOCK();
    (this->last_err_time_).super___atomic_base<long>._M_i = local_310._M_i;
    UNLOCK();
    localtime_r(&local_310._M_i,&local_c0);
    strftime(local_88,100,"%Y-%m-%d %H:%M:%S",&local_c0);
    __s = _stderr;
    local_2f8 = (this->name_)._M_dataplus._M_p;
    sStack_2f0 = (this->name_)._M_string_length;
    local_2e8 = (msg->_M_dataplus)._M_p;
    sStack_2e0 = msg->_M_string_length;
    local_2c8 = 0;
    local_2d8 = &PTR_grow_00124ff0;
    local_2c0 = 500;
    format_str.size_ = 0x21;
    format_str.data_ = "[*** LOG ERROR ***] [{}] [{}] {}\n";
    args.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)local_308;
    args.types_ = 0xbba;
    local_308[0] = local_88;
    local_2d0 = local_2b8;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)&local_2d8,format_str,args,(locale_ref)0x0);
    fwrite(local_2d0,1,local_2c8,__s);
    local_2d8 = &PTR_grow_00124ff0;
    if (local_2d0 != local_2b8) {
      operator_delete(local_2d0,local_2c0);
    }
  }
  return;
}

Assistant:

inline void spdlog::logger::default_err_handler_(const std::string &msg)
{
    auto now = time(nullptr);
    if (now - last_err_time_ < 60)
    {
        return;
    }
    last_err_time_ = now;
    auto tm_time = details::os::localtime(now);
    char date_buf[100];
    std::strftime(date_buf, sizeof(date_buf), "%Y-%m-%d %H:%M:%S", &tm_time);
    fmt::print(stderr, "[*** LOG ERROR ***] [{}] [{}] {}\n", date_buf, name(), msg);
}